

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_sload(ASMState *as,IRIns *ir)

{
  MCode *pMVar1;
  int ofs_00;
  Reg RVar2;
  RegSet allow_00;
  byte bVar3;
  x86Op xVar4;
  int cc;
  Reg tmp;
  Reg dest;
  RegSet allow;
  Reg left;
  Reg base;
  IRType1 t;
  int32_t ofs;
  IRIns *ir_local;
  ASMState *as_local;
  
  ofs_00 = ((ir->field_0).op1 - 2) * 8;
  left._3_1_ = (byte)(ir->field_0).ot;
  if (((((ir->field_0).op2 & 8) == 0) || ((left._3_1_ & 0x80) == 0)) ||
     ((left._3_1_ & 0x1f) != 0x13)) {
    if ((((ir->field_1).r & 0x80) == 0) || ((ir->field_1).s != '\0')) {
      allow_00 = 0xbfef;
      if ((left._3_1_ & 0x1f) == 0xe) {
        allow_00 = 0xffff0000;
      }
      RVar2 = ra_dest(as,ir,allow_00);
      allow = ra_alloc1(as,0x8000,0xbfef);
      if (((ir->field_0).op2 & 8) == 0) {
        if ((left._3_1_ & 0x1f) - 3 < 10) {
          pMVar1 = as->mcp;
          as->mcp = pMVar1 + -1;
          pMVar1[-1] = '\x11';
          emit_rr(as,XO_SHIFTi,0x80205,RVar2);
          if (((ir->field_0).op2 & 4) != 0) {
            asm_guardcc(as,5);
            pMVar1 = as->mcp;
            as->mcp = pMVar1 + -1;
            pMVar1[-1] = left._3_1_ & 0x1f ^ 0xff;
            emit_rr(as,XO_ARITHi8,7,RVar2);
            pMVar1 = as->mcp;
            as->mcp = pMVar1 + -1;
            pMVar1[-1] = 'f';
          }
          if ((as->flags & 0x40) != 0) {
            pMVar1 = as->mcp;
            as->mcp = pMVar1 + -1;
            pMVar1[-1] = '/';
            emit_rmro(as,0xf0fbe3c4,RVar2,allow,ofs_00);
            return;
          }
          if (((ir->field_0).op2 & 4) == 0) {
            pMVar1 = as->mcp;
            as->mcp = pMVar1 + -1;
            pMVar1[-1] = '\x11';
            emit_rr(as,XO_SHIFTi,0x80204,RVar2);
          }
          else {
            pMVar1 = as->mcp;
            as->mcp = pMVar1 + -1;
            pMVar1[-1] = '/';
            emit_rr(as,XO_SHIFTi,0x80201,RVar2);
          }
          emit_rmro(as,XO_MOV,RVar2 | 0x80200,allow,ofs_00);
          return;
        }
        xVar4 = XO_MOV;
        if ((left._3_1_ & 0x1f) == 0xe) {
          xVar4 = XO_MOVSD;
        }
        emit_rmro(as,xVar4,RVar2,allow,ofs_00);
      }
      else {
        bVar3 = left._3_1_ & 0x1f;
        left._3_1_ = 0x13;
        if (bVar3 == 0x13) {
          left._3_1_ = 0xe;
        }
        xVar4 = XO_CVTTSD2SI;
        if (left._3_1_ == 0x13) {
          xVar4 = XO_CVTSI2SD;
        }
        emit_rmro(as,xVar4,RVar2,allow,ofs_00);
      }
    }
    else {
      if (((ir->field_0).op2 & 4) == 0) {
        return;
      }
      allow = ra_alloc1(as,0x8000,0xbfef);
    }
  }
  else {
    RVar2 = ra_scratch(as,0xffff0000);
    asm_tointg(as,ir,RVar2);
    allow = ra_alloc1(as,0x8000,0xbfef);
    emit_rmro(as,XO_MOVSD,RVar2,allow,ofs_00);
    left._3_1_ = 0xe;
  }
  if (((ir->field_0).op2 & 4) != 0) {
    cc = 5;
    if ((left._3_1_ & 0x1f) == 0xe) {
      cc = 3;
    }
    asm_guardcc(as,cc);
    if ((left._3_1_ & 0x1f) < 0xe) {
      if ((left._3_1_ & 0x1f) == 0) {
        pMVar1 = as->mcp;
        as->mcp = pMVar1 + -1;
        pMVar1[-1] = 0xff;
        emit_rmro(as,XO_ARITHi8,0x80207,allow,ofs_00);
      }
      else if ((left._3_1_ & 0x1f) < 3) {
        *(uint *)(as->mcp + -4) = (left._3_1_ & 0x1f ^ 0xffffffff) << 0xf | 0x7fff;
        as->mcp = as->mcp + -4;
        emit_rmro(as,XO_ARITHi,7,allow,ofs_00 + 4);
      }
      else {
        RVar2 = ra_scratch(as,(1 << ((byte)allow & 0x1f) ^ 0xffffffffU) & 0xbfef);
        pMVar1 = as->mcp;
        as->mcp = pMVar1 + -1;
        pMVar1[-1] = left._3_1_ & 0x1f ^ 0xff;
        emit_rr(as,XO_ARITHi8,7,RVar2);
        pMVar1 = as->mcp;
        as->mcp = pMVar1 + -1;
        pMVar1[-1] = '/';
        emit_rr(as,XO_SHIFTi,0x80207,RVar2);
        emit_rmro(as,XO_MOV,RVar2 | 0x80200,allow,ofs_00);
      }
    }
    else {
      pMVar1 = as->mcp;
      pMVar1[-4] = '\0';
      pMVar1[-3] = '\0';
      pMVar1[-2] = 0xf9;
      pMVar1[-1] = 0xff;
      as->mcp = as->mcp + -4;
      emit_rmro(as,XO_ARITHi,7,allow,ofs_00 + 4);
    }
  }
  return;
}

Assistant:

static void asm_sload(ASMState *as, IRIns *ir)
{
  int32_t ofs = 8*((int32_t)ir->op1-1-LJ_FR2) +
		(!LJ_FR2 && (ir->op2 & IRSLOAD_FRAME) ? 4 : 0);
  IRType1 t = ir->t;
  Reg base;
  lj_assertA(!(ir->op2 & IRSLOAD_PARENT),
	     "bad parent SLOAD"); /* Handled by asm_head_side(). */
  lj_assertA(irt_isguard(t) || !(ir->op2 & IRSLOAD_TYPECHECK),
	     "inconsistent SLOAD variant");
  lj_assertA(LJ_DUALNUM ||
	     !irt_isint(t) ||
	     (ir->op2 & (IRSLOAD_CONVERT|IRSLOAD_FRAME|IRSLOAD_KEYINDEX)),
	     "bad SLOAD type");
  if ((ir->op2 & IRSLOAD_CONVERT) && irt_isguard(t) && irt_isint(t)) {
    Reg left = ra_scratch(as, RSET_FPR);
    asm_tointg(as, ir, left);  /* Frees dest reg. Do this before base alloc. */
    base = ra_alloc1(as, REF_BASE, RSET_GPR);
    emit_rmro(as, XO_MOVSD, left, base, ofs);
    t.irt = IRT_NUM;  /* Continue with a regular number type check. */
#if LJ_64 && !LJ_GC64
  } else if (irt_islightud(t)) {
    Reg dest = asm_load_lightud64(as, ir, (ir->op2 & IRSLOAD_TYPECHECK));
    if (ra_hasreg(dest)) {
      base = ra_alloc1(as, REF_BASE, RSET_GPR);
      emit_rmro(as, XO_MOV, dest|REX_64, base, ofs);
    }
    return;
#endif
  } else if (ra_used(ir)) {
    RegSet allow = irt_isnum(t) ? RSET_FPR : RSET_GPR;
    Reg dest = ra_dest(as, ir, allow);
    base = ra_alloc1(as, REF_BASE, RSET_GPR);
    lj_assertA(irt_isnum(t) || irt_isint(t) || irt_isaddr(t),
	       "bad SLOAD type %d", irt_type(t));
    if ((ir->op2 & IRSLOAD_CONVERT)) {
      t.irt = irt_isint(t) ? IRT_NUM : IRT_INT;  /* Check for original type. */
      emit_rmro(as, irt_isint(t) ? XO_CVTSI2SD : XO_CVTTSD2SI, dest, base, ofs);
    } else {
#if LJ_GC64
      if (irt_isaddr(t)) {
	/* LJ_GC64 type check + tag removal without BMI2 and with BMI2:
	**
	**  mov r64, [addr]    rorx r64, [addr], 47
	**  ror r64, 47
	**  cmp r16, itype     cmp r16, itype
	**  jne ->exit         jne ->exit
	**  shr r64, 16        shr r64, 16
	*/
	emit_shifti(as, XOg_SHR|REX_64, dest, 17);
	if ((ir->op2 & IRSLOAD_TYPECHECK)) {
	  asm_guardcc(as, CC_NE);
	  emit_i8(as, irt_toitype(t));
	  emit_rr(as, XO_ARITHi8, XOg_CMP, dest);
	  emit_i8(as, XI_O16);
	}
	if ((as->flags & JIT_F_BMI2)) {
	  emit_i8(as, 47);
	  emit_rmro(as, XV_RORX|VEX_64, dest, base, ofs);
	} else {
	  if ((ir->op2 & IRSLOAD_TYPECHECK))
	    emit_shifti(as, XOg_ROR|REX_64, dest, 47);
	  else
	    emit_shifti(as, XOg_SHL|REX_64, dest, 17);
	  emit_rmro(as, XO_MOV, dest|REX_64, base, ofs);
	}
	return;
      } else
#endif
      emit_rmro(as, irt_isnum(t) ? XO_MOVSD : XO_MOV, dest, base, ofs);
    }
  } else {
    if (!(ir->op2 & IRSLOAD_TYPECHECK))
      return;  /* No type check: avoid base alloc. */
    base = ra_alloc1(as, REF_BASE, RSET_GPR);
  }
  if ((ir->op2 & IRSLOAD_TYPECHECK)) {
    /* Need type check, even if the load result is unused. */
    asm_guardcc(as, irt_isnum(t) ? CC_AE : CC_NE);
    if (LJ_64 && irt_type(t) >= IRT_NUM) {
      lj_assertA(irt_isinteger(t) || irt_isnum(t),
		 "bad SLOAD type %d", irt_type(t));
#if LJ_GC64
      emit_u32(as, LJ_TISNUM << 15);
#else
      emit_u32(as, LJ_TISNUM);
#endif
      emit_rmro(as, XO_ARITHi, XOg_CMP, base, ofs+4);
#if LJ_GC64
    } else if (irt_isnil(t)) {
      /* LJ_GC64 type check for nil:
      **
      **   cmp qword [addr], -1
      **   jne ->exit
      */
      emit_i8(as, -1);
      emit_rmro(as, XO_ARITHi8, XOg_CMP|REX_64, base, ofs);
    } else if (irt_ispri(t)) {
      emit_u32(as, (irt_toitype(t) << 15) | 0x7fff);
      emit_rmro(as, XO_ARITHi, XOg_CMP, base, ofs+4);
    } else {
      /* LJ_GC64 type check only:
      **
      **   mov r64, [addr]
      **   sar r64, 47
      **   cmp r32, itype
      **   jne ->exit
      */
      Reg tmp = ra_scratch(as, rset_exclude(RSET_GPR, base));
      emit_i8(as, irt_toitype(t));
      emit_rr(as, XO_ARITHi8, XOg_CMP, tmp);
      emit_shifti(as, XOg_SAR|REX_64, tmp, 47);
      emit_rmro(as, XO_MOV, tmp|REX_64, base, ofs);
#else
    } else {
      emit_i8(as, irt_toitype(t));
      emit_rmro(as, XO_ARITHi8, XOg_CMP, base, ofs+4);
#endif
    }
  }